

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::IGXMLScanner::scanStartTag(IGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLCh XVar1;
  uint uVar2;
  Grammar *pGVar3;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar4;
  XMLValidator *pXVar5;
  XMLReader *this_01;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *pBVar6;
  XMLDocumentHandler *pXVar7;
  bool bVar8;
  XMLCh XVar9;
  int iVar10;
  undefined4 extraout_var;
  ulong uVar12;
  DTDElementDecl *this_02;
  XMLSize_t XVar13;
  XMLCh *pXVar14;
  DTDAttDef *attDef;
  XMLAttr *pXVar15;
  uint *puVar16;
  undefined4 extraout_var_00;
  XMLCh *pXVar17;
  long *plVar18;
  long lVar19;
  long *plVar20;
  RefHashTableBucketElem<unsigned_int> *pRVar21;
  XMLCh *pXVar22;
  ulong uVar23;
  undefined4 extraout_var_02;
  UnexpectedEOFException *this_03;
  XMLByte *pXVar24;
  RefHashTableBucketElem<unsigned_int> *pRVar25;
  Codes toEmit;
  XMLBuffer *this_04;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar26;
  AttTypes AVar27;
  bool *pbVar28;
  XMLSize_t local_98;
  bool bFoundSpace;
  DTDElementDecl *local_88;
  XMLBuffer *local_80;
  XMLSize_t local_78;
  ulong local_70;
  XMLSize_t local_68;
  bool *local_60;
  ElemStack *local_58;
  XMLValidator *local_50;
  IGXMLScanner *local_48;
  XMLBuffer *local_40;
  XMLSize_t failure;
  DTDElementDecl *pDVar11;
  undefined4 extraout_var_01;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar8 = XMLReader::getName((this->super_XMLScanner).fReaderMgr.fCurReader,
                             &(this->super_XMLScanner).fQNameBuf,false);
  if (!bVar8) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    do {
      XVar9 = ReaderMgr::getNextChar(this_00);
      if (XVar9 == L'\0') {
        return false;
      }
    } while (XVar9 != L'<');
    return false;
  }
  pXVar14 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar14[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar3 = (this->super_XMLScanner).fGrammar;
  local_60 = gotData;
  iVar10 = (*(pGVar3->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar3,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  pDVar11 = (DTDElementDecl *)CONCAT44(extraout_var,iVar10);
  if (pDVar11 == (DTDElementDecl *)0x0) {
    pNVar4 = this->fDTDElemNonDeclPool;
    if (pNVar4->fIdCounter != 0) {
      if ((pXVar14 == (XMLCh *)0x0) || (uVar12 = (ulong)(ushort)*pXVar14, uVar12 == 0)) {
        uVar12 = 0;
      }
      else {
        XVar9 = pXVar14[1];
        if (XVar9 != L'\0') {
          pXVar22 = pXVar14 + 2;
          do {
            uVar12 = (ulong)(ushort)XVar9 + (uVar12 >> 0x18) + uVar12 * 0x26;
            XVar9 = *pXVar22;
            pXVar22 = pXVar22 + 1;
          } while (XVar9 != L'\0');
        }
        uVar12 = uVar12 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar26 = (pNVar4->fBucketList).fBucketList[uVar12];
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar8 = StringHasher::equals
                            ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar14,pRVar26->fKey
                            );
          if (bVar8) goto LAB_002a8880;
          pRVar26 = pRVar26->fNext;
        } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
      pRVar26 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_002a8880:
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        pDVar11 = pRVar26->fData;
        goto LAB_002a888e;
      }
    }
    pDVar11 = (DTDElementDecl *)0x0;
  }
LAB_002a888e:
  this_02 = pDVar11;
  if (pDVar11 == (DTDElementDecl *)0x0) {
    this_02 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_02,pXVar14,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar13 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_02);
    (this_02->super_XMLElementDecl).fId = XVar13;
  }
  bVar8 = (this->super_XMLScanner).fValidate;
  if (pDVar11 == (DTDElementDecl *)0x0) {
    if (bVar8 != false) {
      (this_02->super_XMLElementDecl).fCreateReason = JustFaultIn;
      goto LAB_002a88fb;
    }
  }
  else if ((bVar8 != false) && ((this_02->super_XMLElementDecl).fCreateReason != Declared)) {
LAB_002a88fb:
    pXVar5 = (this->super_XMLScanner).fValidator;
    pXVar14 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
    XMLValidator::emitError(pXVar5,ElementNotDefined,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
    ;
  }
  local_58 = &(this->super_XMLScanner).fElemStack;
  local_78 = (this->super_XMLScanner).fElemStack.fStackTop;
  ElemStack::addLevel(local_58,&this_02->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  bVar8 = (this->super_XMLScanner).fValidate;
  (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]->
  fValidationFlag = bVar8;
  if (bVar8 == true) {
    pXVar5 = (this->super_XMLScanner).fValidator;
    (*pXVar5->_vptr_XMLValidator[9])(pXVar5,this_02);
  }
  if (local_78 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar14 = (this->super_XMLScanner).fRootElemName, pXVar14 != (XMLCh *)0x0)) {
      pXVar22 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar22[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
      if (pXVar22 != pXVar14) {
        if (pXVar22 == (XMLCh *)0x0) {
LAB_002a89f3:
          if (*pXVar14 == L'\0') goto LAB_002a8a0a;
        }
        else {
          do {
            XVar9 = *pXVar22;
            if (XVar9 == L'\0') goto LAB_002a89f3;
            pXVar22 = pXVar22 + 1;
            XVar1 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar9 == XVar1);
        }
        XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
      }
    }
  }
  else {
    ElemStack::addChild(local_58,(this_02->super_XMLElementDecl).fElementName,true);
  }
LAB_002a8a0a:
  ReaderMgr::skipPastSpaces(this_00);
  local_68 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
             fCurCount;
  this->fElemCount = this->fElemCount + 1;
  local_80 = &(this->super_XMLScanner).fAttNameBuf;
  local_40 = &(this->super_XMLScanner).fAttValueBuf;
  local_98 = 0;
  local_70 = 0;
  local_88 = this_02;
  local_48 = this;
  do {
    XVar9 = ReaderMgr::peekNextChar(this_00);
    if (((local_98 != 0) && (XVar9 != L'/')) && (XVar9 != L'>')) {
      ReaderMgr::skipPastSpaces(this_00,&bFoundSpace,false);
      if (bFoundSpace == false) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
      XVar9 = ReaderMgr::peekNextChar(this_00);
    }
    this_01 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    pXVar24 = this_01->fgCharCharsTable;
    if ((pXVar24[(ushort)XVar9] & 0x10) == 0) {
      local_80->fIndex = 0;
      bVar8 = XMLReader::getName(this_01,local_80,false);
      if (bVar8) {
        bVar8 = XMLScanner::scanEq(&this->super_XMLScanner,false);
        if (!bVar8) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
          XVar9 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
          if ((ushort)XVar9 < 0x2f) {
            if ((XVar9 != L'\"') && (XVar9 != L'\'')) {
LAB_002a8c5c:
              if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                             [(ushort)XVar9]) {
                iVar10 = 1;
                if (XVar9 == L'<') {
                  pXVar14 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
                  bVar8 = false;
                  XMLScanner::emitError
                            (&this->super_XMLScanner,UnterminatedStartTag,pXVar14,(XMLCh *)0x0,
                             (XMLCh *)0x0,(XMLCh *)0x0);
                }
                else {
                  bVar8 = false;
                }
                goto LAB_002a8cac;
              }
            }
            iVar10 = 0;
            bVar8 = true;
          }
          else {
            iVar10 = 2;
            bVar8 = false;
            if ((XVar9 != L'/') && (XVar9 != L'>')) goto LAB_002a8c5c;
          }
LAB_002a8cac:
          if (!bVar8) goto LAB_002a8f9e;
        }
        pXVar14 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        attDef = DTDElementDecl::getAttDef(this_02,pXVar14);
        if (local_98 < local_68) {
          pXVar15 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                              (&((this->super_XMLScanner).fAttrList)->
                                super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_98);
          if (attDef == (DTDAttDef *)0x0) {
            AVar27 = AttTypes_Min;
          }
          else {
            AVar27 = (attDef->super_XMLAttDef).fType;
          }
          QName::setName(pXVar15->fAttName,L"",pXVar14,0);
          XMLAttr::setValue(pXVar15,L"");
          pXVar15->fType = AVar27;
          pXVar15->fSpecified = true;
          this = local_48;
        }
        else {
          pXVar15 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
          if (attDef == (DTDAttDef *)0x0) {
            AVar27 = AttTypes_Min;
          }
          else {
            AVar27 = (attDef->super_XMLAttDef).fType;
          }
          XMLAttr::XMLAttr(pXVar15,0,pXVar14,L"",L"",AVar27,true,
                           (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,false);
          pBVar6 = &((this->super_XMLScanner).fAttrList)->
                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
          BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(pBVar6,1);
          XVar13 = pBVar6->fCurCount;
          pBVar6->fElemList[XVar13] = pXVar15;
          pBVar6->fCurCount = XVar13 + 1;
        }
        pXVar14 = pXVar15->fAttName->fLocalPart;
        if (attDef == (DTDAttDef *)0x0) {
          if ((this->super_XMLScanner).fValidate == true) {
            pXVar22 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
            local_50 = (this->super_XMLScanner).fValidator;
            pXVar22[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
            pXVar17 = QName::getRawName((local_88->super_XMLElementDecl).fElementName);
            XMLValidator::emitError
                      (local_50,AttNotDefinedForElement,pXVar22,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          bVar8 = Hash2KeysSetOf<xercesc_4_0::StringHasher>::putIfNotPresent
                            (this->fUndeclaredAttrRegistry,pXVar14,0);
          if (!bVar8) {
            pXVar17 = QName::getRawName((local_88->super_XMLElementDecl).fElementName);
            pXVar22 = pXVar14;
LAB_002a8ef9:
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar22,pXVar17,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
        }
        else {
          pRVar21 = this->fAttDefRegistry->fBucketList
                    [(ulong)attDef % this->fAttDefRegistry->fHashModulus];
          pRVar25 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          if (pRVar21 != (RefHashTableBucketElem<unsigned_int> *)0x0) {
            do {
              pRVar25 = pRVar21;
              if ((DTDAttDef *)pRVar21->fKey == attDef) goto LAB_002a8e91;
              pRVar21 = pRVar21->fNext;
            } while (pRVar21 != (RefHashTableBucketElem<unsigned_int> *)0x0);
            pRVar25 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          }
LAB_002a8e91:
          if (pRVar25 == (RefHashTableBucketElem<unsigned_int> *)0x0) {
            puVar16 = (uint *)0x0;
          }
          else {
            puVar16 = pRVar25->fData;
          }
          if (puVar16 == (uint *)0x0) {
            puVar16 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
            *puVar16 = this->fElemCount;
            RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                      (this->fAttDefRegistry,attDef,puVar16);
          }
          else {
            if (this->fElemCount <= *puVar16) {
              iVar10 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                                 (attDef);
              pXVar17 = QName::getRawName((local_88->super_XMLElementDecl).fElementName);
              pXVar22 = (XMLCh *)CONCAT44(extraout_var_00,iVar10);
              goto LAB_002a8ef9;
            }
            *puVar16 = this->fElemCount;
          }
        }
        ReaderMgr::skipPastSpaces(this_00);
        bVar8 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar14,local_40);
        if (!bVar8) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
          XVar9 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
          this_02 = local_88;
          if (((XVar9 != L'/') && (XVar9 != L'>')) &&
             (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                         [(ushort)XVar9])) {
            iVar10 = 1;
            if (XVar9 == L'<') {
              pXVar14 = QName::getRawName((local_88->super_XMLElementDecl).fElementName);
              XMLScanner::emitError
                        (&this->super_XMLScanner,UnterminatedStartTag,pXVar14,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
            }
            goto LAB_002a8f9e;
          }
        }
        pXVar14 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
        XMLAttr::setValue(pXVar15,pXVar14);
        this_02 = local_88;
        if ((attDef != (DTDAttDef *)0x0) && ((this->super_XMLScanner).fValidate == true)) {
          pXVar14 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
          pXVar5 = (this->super_XMLScanner).fValidator;
          pXVar14[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
          (*pXVar5->_vptr_XMLValidator[8])(pXVar5,attDef,pXVar14,0);
        }
        local_98 = local_98 + 1;
        iVar10 = 2;
      }
      else {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        do {
          XVar9 = ReaderMgr::getNextChar(this_00);
          if (XVar9 == L'\0') break;
        } while (XVar9 != L'>');
        iVar10 = 1;
      }
    }
    else {
      iVar10 = 0;
      if ((ushort)XVar9 < 0x2f) {
        if ((XVar9 == L'\"') || (XVar9 == L'\'')) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
          ReaderMgr::getNextChar(this_00);
          ReaderMgr::skipQuotedString(this_00,XVar9);
          ReaderMgr::skipPastSpaces(this_00);
          iVar10 = 2;
        }
        else {
          iVar10 = 0;
          if (XVar9 == L'\0') {
            this_03 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
            UnexpectedEOFException::UnexpectedEOFException
                      (this_03,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                       ,0x77c,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
            __cxa_throw(this_03,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
          }
        }
      }
      else if (XVar9 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar8 = ReaderMgr::skippedChar(this_00,L'>');
        local_70 = CONCAT71((int7)((ulong)pXVar24 >> 8),1);
        iVar10 = 3;
        if (!bVar8) {
          pXVar14 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      else {
        if (XVar9 == L'<') {
          pXVar14 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar14,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        else {
          if (XVar9 != L'>') goto LAB_002a8f9e;
          ReaderMgr::getNextChar(this_00);
        }
        iVar10 = 3;
      }
    }
LAB_002a8f9e:
  } while ((iVar10 == 0) || (iVar10 == 2));
  if (iVar10 != 3) {
    return false;
  }
  if (local_98 != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  }
  iVar10 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(this_02);
  if ((char)iVar10 != '\0') {
    iVar10 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(this_02);
    plVar18 = (long *)CONCAT44(extraout_var_01,iVar10);
    lVar19 = (**(code **)(*plVar18 + 0x50))(plVar18);
    if (lVar19 != 0) {
      uVar12 = 0;
      do {
        plVar20 = (long *)(**(code **)(*plVar18 + 0x58))(plVar18,uVar12);
        pRVar21 = this->fAttDefRegistry->fBucketList
                  [(ulong)plVar20 % this->fAttDefRegistry->fHashModulus];
        pRVar25 = (RefHashTableBucketElem<unsigned_int> *)0x0;
        if (pRVar21 != (RefHashTableBucketElem<unsigned_int> *)0x0) {
          do {
            pRVar25 = pRVar21;
            if ((long *)pRVar21->fKey == plVar20) goto LAB_002a90b6;
            pRVar21 = pRVar21->fNext;
          } while (pRVar21 != (RefHashTableBucketElem<unsigned_int> *)0x0);
          pRVar25 = (RefHashTableBucketElem<unsigned_int> *)0x0;
        }
LAB_002a90b6:
        uVar2 = *(uint *)(plVar20 + 1);
        if (pRVar25 == (RefHashTableBucketElem<unsigned_int> *)0x0) {
          puVar16 = (uint *)0x0;
        }
        else {
          puVar16 = pRVar25->fData;
        }
        if ((puVar16 == (uint *)0x0) || (*puVar16 < this->fElemCount)) {
          if ((this->super_XMLScanner).fValidate == true) {
            if (uVar2 == 2) {
              this_04 = (XMLBuffer *)(this->super_XMLScanner).fValidator;
              pXVar14 = (XMLCh *)(**(code **)(*plVar20 + 0x28))(plVar20);
              toEmit = RequiredAttrNotProvided;
              pXVar22 = (XMLCh *)0x0;
            }
            else {
              if (((1 < uVar2) || ((this->super_XMLScanner).fStandalone != true)) ||
                 (*(char *)((long)plVar20 + 0x14) != '\x01')) goto LAB_002a9157;
              local_80 = (XMLBuffer *)(this->super_XMLScanner).fValidator;
              pXVar14 = (XMLCh *)(**(code **)(*plVar20 + 0x28))(plVar20);
              pXVar22 = QName::getRawName((local_88->super_XMLElementDecl).fElementName);
              toEmit = NoDefAttForStandalone;
              this_04 = local_80;
            }
            XMLValidator::emitError
                      ((XMLValidator *)this_04,toEmit,pXVar14,pXVar22,(XMLCh *)0x0,(XMLCh *)0x0);
          }
LAB_002a9157:
          if (uVar2 < 2) {
            if ((this->super_XMLScanner).fValidate == true) {
              pXVar5 = (this->super_XMLScanner).fValidator;
              (*pXVar5->_vptr_XMLValidator[8])(pXVar5,plVar20,plVar20[4],0);
            }
            if (local_98 < local_68) {
              pXVar15 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                  (&((this->super_XMLScanner).fAttrList)->
                                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_98);
              pXVar14 = (XMLCh *)(**(code **)(*plVar20 + 0x28))(plVar20);
              local_80 = (XMLBuffer *)plVar20[4];
              AVar27 = *(AttTypes *)((long)plVar20 + 0xc);
              QName::setName(pXVar15->fAttName,L"",pXVar14,0);
              XMLAttr::setValue(pXVar15,(XMLCh *)local_80);
              pXVar15->fType = AVar27;
              pXVar15->fSpecified = false;
            }
            else {
              pXVar15 = (XMLAttr *)
                        XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
              pXVar14 = (XMLCh *)(**(code **)(*plVar20 + 0x28))(plVar20);
              XMLAttr::XMLAttr(pXVar15,0,pXVar14,L"",(XMLCh *)plVar20[4],
                               *(AttTypes *)((long)plVar20 + 0xc),false,
                               (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                               false);
              pBVar6 = &((this->super_XMLScanner).fAttrList)->
                        super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
              BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(pBVar6,1);
              XVar13 = pBVar6->fCurCount;
              pBVar6->fElemList[XVar13] = pXVar15;
              pBVar6->fCurCount = XVar13 + 1;
              local_68 = local_68 + 1;
            }
            local_98 = local_98 + 1;
          }
        }
        uVar12 = uVar12 + 1;
        uVar23 = (**(code **)(*plVar18 + 0x50))(plVar18);
      } while (uVar12 < uVar23);
    }
  }
  pbVar28 = local_60;
  pDVar11 = local_88;
  if ((local_70 & 1) != 0) {
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar5 = (this->super_XMLScanner).fValidator,
       iVar10 = (*pXVar5->_vptr_XMLValidator[2])(pXVar5,local_88,0,0), (char)iVar10 == '\0')) {
      pXVar5 = (this->super_XMLScanner).fValidator;
      pXVar14 = QName::getRawName((pDVar11->super_XMLElementDecl).fElementName);
      iVar10 = (*(pDVar11->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                         (pDVar11);
      pbVar28 = local_60;
      XMLValidator::emitError
                (pXVar5,ElementNotValidForContent,pXVar14,(XMLCh *)CONCAT44(extraout_var_02,iVar10),
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    ElemStack::popTop(local_58);
    if (local_78 == 0) {
      *pbVar28 = false;
    }
    else {
      (this->super_XMLScanner).fValidate =
           (this->super_XMLScanner).fElemStack.fStack
           [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag;
    }
  }
  pXVar7 = (this->super_XMLScanner).fDocHandler;
  if (pXVar7 != (XMLDocumentHandler *)0x0) {
    (*pXVar7->_vptr_XMLDocumentHandler[0xb])
              (pXVar7,pDVar11,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,
               (this->super_XMLScanner).fAttrList,local_98,(ulong)((byte)local_70 & 1),
               (ulong)(local_78 == 0));
    return true;
  }
  return true;
}

Assistant:

bool IGXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.
    if (!fReaderMgr.getName(fQNameBuf))
    {
        emitError(XMLErrs::ExpectedElementName);
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We tell him to fault in a decl if he does not find one.
    //  Actually, we *don't* tell him to fault in a decl if he does not find one- NG
    bool wasAdded = false;
    const XMLCh *rawQName = fQNameBuf.getRawBuffer();
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , rawQName
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look for it in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(rawQName);
    }
    if(!elemDecl)
    {
        // we're assuming this must be a DTD element.  DTD's can be
        // used with or without namespaces, but schemas cannot be used without
        // namespaces.
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            rawQName
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    //  We do something different here according to whether we found the
    //  element or not.
    if (wasAdded)
    {
        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }
    else
    {
        // If its not marked declared and validating, then emit an error
        if (fValidate && !elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , elemDecl->getFullName()
            );
        }
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setValidationFlag(fValidate);

    //  Validate the element
    if (fValidate)
        fValidator->validateElement(elemDecl);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(fQNameBuf.getRawBuffer(), fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                bool bFoundSpace;
                fReaderMgr.skipPastSpaces(bFoundSpace);
                if (!bFoundSpace)
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
                // Ok, peek another char
                nextCh = fReaderMgr.peekNextChar();
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.
            if (!fReaderMgr.getName(fAttNameBuf))
            {
                emitError(XMLErrs::ExpectedAttrName);
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            if (attCount >= curAttListSize)
            {
                curAtt = new (fMemoryManager) XMLAttr
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                    , true
                    , fMemoryManager
                );
                fAttrList->addElement(curAtt);
            }
            else
            {
                curAtt = fAttrList->elementAt(attCount);
                curAtt->set
                (
                    0
                    , namePtr
                    , XMLUni::fgZeroLenString
                    , XMLUni::fgZeroLenString
                    , (attDef)?attDef->getType():XMLAttDef::CData
                );
                curAtt->setSpecified(true);
            }
            // reset namePtr so it refers to newly-allocated memory
            namePtr = (XMLCh *)curAtt->getName();

            if (!attDef)
            {
                //  If there is a validation handler, then we are validating
                //  so emit an error.
                if (fValidate)
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer()
                        , elemDecl->getFullName()
                    );
                }
                if(!fUndeclaredAttrRegistry->putIfNotPresent(namePtr, 0))
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , namePtr
                        , elemDecl->getFullName()
                     );
                }
            }
            else
            {
                // prepare for duplicate detection
                unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                if(!curCountPtr)
                {
                    curCountPtr = getNewUIntPtr();
                    *curCountPtr = fElemCount;
                    fAttDefRegistry->put(attDef, curCountPtr);
                }
                else if(*curCountPtr < fElemCount)
                    *curCountPtr = fElemCount;
                else
                {
                    emitError
                    (
                        XMLErrs::AttrAlreadyUsedInSTag
                        , attDef->getFullName()
                        , elemDecl->getFullName()
                    );
                }
            }

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }
            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(fAttValueBuf.getRawBuffer());

            //  Now that its all stretched out, lets look at its type and
            //  determine if it has a valid value. It will output any needed
            //  errors, but we just keep going. We only need to do this if
            //  we are validating.
            if (attDef)
            {
                // Let the validator pass judgement on the attribute value
                if (fValidate)
                {
                    fValidator->validateAttrValue
                    (
                        attDef
                        , fAttValueBuf.getRawBuffer()
                        , false
                        , elemDecl
                    );
                }
            }

            attCount++;
            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (elemDecl->hasAttDefs())
    {
        // N.B.:  this assumes DTD validation.
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            const XMLAttDef& curDef = attDefList.getAttDef(i);
            const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());

                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (attCount >= curAttListSize)
                    {
                        curAtt = new (fMemoryManager) XMLAttr
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                            , false
                            , fMemoryManager
                        );
                        fAttrList->addElement(curAtt);
                        curAttListSize++;
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(attCount);
                        curAtt->set
                        (
                            0
                            , curDef.getFullName()
                            , XMLUni::fgZeroLenString
                            , curDef.getValue()
                            , curDef.getType()
                        );
                        curAtt->setSpecified(false);
                    }
                    attCount++;
                }
            }
        }
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
        else {
            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl
            , fEmptyNamespaceId
            , 0
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    return true;
}